

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Valuator.cxx
# Opt level: O0

int __thiscall Fl_Valuator::format(Fl_Valuator *this,char *buffer)

{
  int iVar1;
  size_t sVar2;
  double dVar3;
  char local_58 [8];
  char temp [32];
  uint local_30;
  int local_2c;
  int c;
  int i;
  double v;
  char *buffer_local;
  Fl_Valuator *this_local;
  
  dVar3 = value(this);
  if (((this->A == 0.0) && (!NAN(this->A))) || (this->B == 0)) {
    this_local._4_4_ = snprintf(buffer,0x80,"%g",dVar3);
  }
  else {
    local_30 = 0;
    snprintf(local_58,0x20,"%.12f",this->A / (double)this->B);
    sVar2 = strlen(local_58);
    local_2c = (int)sVar2;
    do {
      local_2c = local_2c + -1;
      if (local_2c < 1) break;
    } while (local_58[local_2c] == '0');
    while ((0 < local_2c && (iVar1 = isdigit((int)local_58[local_2c]), iVar1 != 0))) {
      local_2c = local_2c + -1;
      local_30 = local_30 + 1;
    }
    this_local._4_4_ = snprintf(buffer,0x80,"%.*f",dVar3,(ulong)local_30);
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Valuator::format(char* buffer) {
  double v = value();
  // MRS: THIS IS A HACK - RECOMMEND ADDING BUFFER SIZE ARGUMENT
  if (!A || !B) return snprintf(buffer, 128, "%g", v);

  // Figure out how many digits are required to correctly format the
  // value.
  int i, c = 0;
  char temp[32];
  // output a number with many digits after the decimal point. This
  // seems to be needed to get high precission
  snprintf(temp, sizeof(temp), "%.12f", A/B);
  // strip all trailing 0's
  for (i=(int) strlen(temp)-1; i>0; i--) {
    if (temp[i]!='0') break;
  }
  // count digits until we find the decimal point (or comma or whatever
  // letter is set in the current locale)
  for (; i>0; i--, c++) {
    if (!isdigit(temp[i])) break;
  }

  // MRS: THIS IS A HACK - RECOMMEND ADDING BUFFER SIZE ARGUMENT
  return snprintf(buffer, 128, "%.*f", c, v);
}